

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_string(mg_session *session,mg_string **str)

{
  int iVar1;
  mg_string *pmVar2;
  undefined8 *in_RSI;
  mg_session *in_RDI;
  mg_string *tstr;
  int status;
  uint32_t size;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_read_container_size
                    (_status,&tstr->size,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    if (in_RDI->in_end < in_RDI->in_cursor + (ulong)in_stack_ffffffffffffffe4) {
      mg_session_set_error(in_RDI,"unexpected end of message");
      iVar1 = -6;
    }
    else {
      pmVar2 = mg_string_alloc((uint32_t)((ulong)in_RSI >> 0x20),
                               (mg_allocator *)((ulong)in_stack_ffffffffffffffe4 << 0x20));
      if (pmVar2 == (mg_string *)0x0) {
        mg_session_set_error(in_RDI,"out of memory");
        iVar1 = -3;
      }
      else {
        pmVar2->size = in_stack_ffffffffffffffe4;
        memcpy(pmVar2->data,in_RDI->in_buffer + in_RDI->in_cursor,(ulong)in_stack_ffffffffffffffe4);
        in_RDI->in_cursor = (ulong)in_stack_ffffffffffffffe4 + in_RDI->in_cursor;
        *in_RSI = pmVar2;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_string(mg_session *session, mg_string **str) {
  uint32_t size;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &size, MG_MARKERS_STRING));

  if (session->in_cursor + size > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }

  mg_string *tstr = mg_string_alloc(size, session->decoder_allocator);
  if (!tstr) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  tstr->size = size;
  memcpy(tstr->data, session->in_buffer + session->in_cursor, size);
  session->in_cursor += size;
  *str = tstr;
  return 0;
}